

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          CodedInputStream *input,FieldSkipper *field_skipper)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  LogMessage *other;
  MessageLite *local_1c0;
  MessageLite *local_1b8;
  string *local_1b0;
  string *local_1a8;
  MessageLite *value_31;
  MessageLite *value_30;
  string *value_29;
  string *value_28;
  int value_27;
  bool value_26;
  double value_25;
  int64_t iStack_140;
  float value_24;
  int64_t value_23;
  uint64_t uStack_130;
  int32_t value_22;
  uint64_t value_21;
  int64_t iStack_120;
  uint32_t value_20;
  int64_t value_19;
  uint64_t uStack_110;
  int32_t value_18;
  uint64_t value_17;
  int64_t iStack_100;
  uint32_t value_16;
  int64_t value_15;
  LogFinisher local_ed;
  int32_t value_14;
  LogMessage local_e0;
  uint local_a8;
  bool local_a1;
  int value_13;
  bool value_12;
  double value_11;
  int64_t iStack_90;
  float value_10;
  int64_t value_9;
  uint64_t uStack_80;
  int32_t value_8;
  uint64_t value_7;
  int64_t iStack_70;
  uint32_t value_6;
  int64_t value_5;
  uint64_t uStack_60;
  int32_t value_4;
  uint64_t value_3;
  int64_t iStack_50;
  uint32_t value_2;
  int64_t value_1;
  Limit local_40;
  int32_t value;
  Limit limit;
  uint32_t size;
  FieldSkipper *field_skipper_local;
  CodedInputStream *input_local;
  ExtensionInfo *extension_local;
  bool was_packed_on_wire_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  _limit = field_skipper;
  field_skipper_local = (FieldSkipper *)input;
  input_local = (CodedInputStream *)extension;
  extension_local._3_1_ = was_packed_on_wire;
  extension_local._4_4_ = number;
  pEStack_18 = this;
  if (was_packed_on_wire) {
    bVar3 = io::CodedInputStream::ReadVarint32(input,(uint32_t *)&value);
    if (!bVar3) {
      return false;
    }
    local_40 = io::CodedInputStream::PushLimit((CodedInputStream *)field_skipper_local,value);
    switch(*(undefined1 *)((long)&input_local->buffer_end_ + 4)) {
    case 1:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          ((CodedInputStream *)field_skipper_local,(double *)&value_13);
        if (!bVar3) {
          return false;
        }
        AddDouble(this,extension_local._4_4_,'\x01',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),_value_13,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 2:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          ((CodedInputStream *)field_skipper_local,(float *)((long)&value_11 + 4));
        if (!bVar3) {
          return false;
        }
        AddFloat(this,extension_local._4_4_,'\x02',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_11._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 3:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          ((CodedInputStream *)field_skipper_local,&stack0xffffffffffffffb0);
        if (!bVar3) {
          return false;
        }
        AddInt64(this,extension_local._4_4_,'\x03',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),iStack_50,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 4:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          ((CodedInputStream *)field_skipper_local,&stack0xffffffffffffffa0);
        if (!bVar3) {
          return false;
        }
        AddUInt64(this,extension_local._4_4_,'\x04',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),uStack_60,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 5:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          ((CodedInputStream *)field_skipper_local,(int32_t *)((long)&value_1 + 4));
        if (!bVar3) {
          return false;
        }
        AddInt32(this,extension_local._4_4_,'\x05',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_1._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 6:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)6>
                          ((CodedInputStream *)field_skipper_local,&stack0xffffffffffffff80);
        if (!bVar3) {
          return false;
        }
        AddUInt64(this,extension_local._4_4_,'\x06',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),uStack_80,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 7:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)7>
                          ((CodedInputStream *)field_skipper_local,(uint32_t *)((long)&value_7 + 4))
        ;
        if (!bVar3) {
          return false;
        }
        AddUInt32(this,extension_local._4_4_,'\a',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_7._4_4_,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 8:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          ((CodedInputStream *)field_skipper_local,&local_a1);
        if (!bVar3) {
          return false;
        }
        AddBool(this,extension_local._4_4_,'\b',
                (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),(bool)(local_a1 & 1),
                *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      LogMessage::LogMessage
                (&local_e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x55c);
      other = LogMessage::operator<<(&local_e0,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_ed,other);
      LogMessage::~LogMessage(&local_e0);
      break;
    case 0xd:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          ((CodedInputStream *)field_skipper_local,(uint32_t *)((long)&value_3 + 4))
        ;
        if (!bVar3) {
          return false;
        }
        AddUInt32(this,extension_local._4_4_,'\r',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_3._4_4_,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 0xe:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          ((CodedInputStream *)field_skipper_local,(int *)&local_a8);
        if (!bVar3) {
          return false;
        }
        uVar1._0_4_ = input_local->total_bytes_read_;
        uVar1._4_4_ = input_local->overflow_bytes_;
        uVar5 = (*(code *)input_local->input_)(uVar1,local_a8);
        if ((uVar5 & 1) == 0) {
          (*_limit->_vptr_FieldSkipper[4])(_limit,(ulong)extension_local._4_4_,(ulong)local_a8);
        }
        else {
          AddEnum(this,extension_local._4_4_,'\x0e',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),local_a8,
                  *(FieldDescriptor **)&input_local->last_tag_);
        }
      }
      break;
    case 0xf:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                          ((CodedInputStream *)field_skipper_local,(int32_t *)((long)&value_9 + 4));
        if (!bVar3) {
          return false;
        }
        AddInt32(this,extension_local._4_4_,'\x0f',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_9._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 0x10:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                          ((CodedInputStream *)field_skipper_local,&stack0xffffffffffffff70);
        if (!bVar3) {
          return false;
        }
        AddInt64(this,extension_local._4_4_,'\x10',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),iStack_90,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 0x11:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                          ((CodedInputStream *)field_skipper_local,(int32_t *)((long)&value_5 + 4));
        if (!bVar3) {
          return false;
        }
        AddInt32(this,extension_local._4_4_,'\x11',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_5._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case 0x12:
      while (iVar4 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)field_skipper_local),
            0 < iVar4) {
        bVar3 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                          ((CodedInputStream *)field_skipper_local,&stack0xffffffffffffff90);
        if (!bVar3) {
          return false;
        }
        AddInt64(this,extension_local._4_4_,'\x12',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),iStack_70,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)field_skipper_local,local_40);
  }
  else {
    switch(extension->type) {
    case '\x01':
      bVar3 = WireFormatLite::
              ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                        (input,(double *)&value_27);
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetDouble(this,extension_local._4_4_,'\x01',_value_27,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddDouble(this,extension_local._4_4_,'\x01',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),_value_27,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x02':
      bVar3 = WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,(float *)((long)&value_25 + 4));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetFloat(this,extension_local._4_4_,'\x02',value_25._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddFloat(this,extension_local._4_4_,'\x02',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_25._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x03':
      bVar3 = WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                        (input,&stack0xffffffffffffff00);
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x03',iStack_100,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x03',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),iStack_100,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x04':
      bVar3 = WireFormatLite::
              ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                        (input,&stack0xfffffffffffffef0);
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x04',uStack_110,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x04',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),uStack_110,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x05':
      bVar3 = WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,(int32_t *)((long)&value_15 + 4));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x05',value_15._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x05',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_15._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x06':
      bVar3 = WireFormatLite::
              ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)6>
                        (input,&stack0xfffffffffffffed0);
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x06',uStack_130,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x06',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),uStack_130,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\a':
      bVar3 = WireFormatLite::
              ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)7>
                        (input,(uint32_t *)((long)&value_21 + 4));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetUInt32(this,extension_local._4_4_,'\a',value_21._4_4_,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\a',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_21._4_4_,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\b':
      bVar3 = WireFormatLite::
              ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,(bool *)((long)&value_28 + 7));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetBool(this,extension_local._4_4_,'\b',(bool)(value_28._7_1_ & 1),
                *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddBool(this,extension_local._4_4_,'\b',
                (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),
                (bool)(value_28._7_1_ & 1),*(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\t':
      if ((extension->is_repeated & 1U) == 0) {
        local_1a8 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      else {
        local_1a8 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      bVar3 = WireFormatLite::ReadString((CodedInputStream *)field_skipper_local,local_1a8);
      if (!bVar3) {
        return false;
      }
      break;
    case '\n':
      if ((extension->is_repeated & 1U) == 0) {
        local_1b8 = MutableMessage(this,number,'\n',
                                   (MessageLite *)(extension->field_5).enum_validity_check.func,
                                   extension->descriptor);
      }
      else {
        local_1b8 = AddMessage(this,number,'\n',
                               (MessageLite *)(extension->field_5).enum_validity_check.func,
                               extension->descriptor);
      }
      bVar3 = WireFormatLite::ReadGroup<google::protobuf::MessageLite>
                        (extension_local._4_4_,(CodedInputStream *)field_skipper_local,local_1b8);
      if (!bVar3) {
        return false;
      }
      break;
    case '\v':
      if ((extension->is_repeated & 1U) == 0) {
        local_1c0 = MutableMessage(this,number,'\v',
                                   (MessageLite *)(extension->field_5).enum_validity_check.func,
                                   extension->descriptor);
      }
      else {
        local_1c0 = AddMessage(this,number,'\v',
                               (MessageLite *)(extension->field_5).enum_validity_check.func,
                               extension->descriptor);
      }
      bVar3 = WireFormatLite::ReadMessage<google::protobuf::MessageLite>
                        ((CodedInputStream *)field_skipper_local,local_1c0);
      if (!bVar3) {
        return false;
      }
      break;
    case '\f':
      if ((extension->is_repeated & 1U) == 0) {
        local_1b0 = MutableString_abi_cxx11_(this,number,'\f',extension->descriptor);
      }
      else {
        local_1b0 = AddString_abi_cxx11_(this,number,'\f',extension->descriptor);
      }
      bVar3 = WireFormatLite::ReadBytes((CodedInputStream *)field_skipper_local,local_1b0);
      if (!bVar3) {
        return false;
      }
      break;
    case '\r':
      bVar3 = WireFormatLite::
              ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                        (input,(uint32_t *)((long)&value_17 + 4));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetUInt32(this,extension_local._4_4_,'\r',value_17._4_4_,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\r',
                  (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_17._4_4_,
                  *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x0e':
      bVar3 = WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,(int *)&value_28);
      if (!bVar3) {
        return false;
      }
      uVar2._0_4_ = input_local->total_bytes_read_;
      uVar2._4_4_ = input_local->overflow_bytes_;
      uVar5 = (*(code *)input_local->input_)(uVar2,(uint)value_28);
      if ((uVar5 & 1) == 0) {
        (*_limit->_vptr_FieldSkipper[4])(_limit,(ulong)extension_local._4_4_,(ulong)(uint)value_28);
      }
      else if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetEnum(this,extension_local._4_4_,'\x0e',(uint)value_28,
                *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddEnum(this,extension_local._4_4_,'\x0e',
                (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),(uint)value_28,
                *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x0f':
      bVar3 = WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                        (input,(int32_t *)((long)&value_23 + 4));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x0f',value_23._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x0f',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_23._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x10':
      bVar3 = WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                        (input,&stack0xfffffffffffffec0);
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x10',iStack_140,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x10',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),iStack_140,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x11':
      bVar3 = WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                        (input,(int32_t *)((long)&value_19 + 4));
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x11',value_19._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x11',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),value_19._4_4_,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      break;
    case '\x12':
      bVar3 = WireFormatLite::
              ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                        (input,&stack0xfffffffffffffee0);
      if (!bVar3) {
        return false;
      }
      if (((ulong)input_local->buffer_end_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x12',iStack_120,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x12',
                 (bool)(*(byte *)((long)&input_local->buffer_end_ + 6) & 1),iStack_120,
                 *(FieldDescriptor **)&input_local->last_tag_);
      }
    }
  }
  return true;
}

Assistant:

bool ExtensionSet::ParseFieldWithExtensionInfo(int number,
                                               bool was_packed_on_wire,
                                               const ExtensionInfo& extension,
                                               io::CodedInputStream* input,
                                               FieldSkipper* field_skipper) {
  // Explicitly not read extension.is_packed, instead check whether the field
  // was encoded in packed form on the wire.
  if (was_packed_on_wire) {
    uint32_t size;
    if (!input->ReadVarint32(&size)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(size);

    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE:                                    \
    while (input->BytesUntilLimit() > 0) {                                  \
      CPP_LOWERCASE value;                                                  \
      if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                     \
                                         WireFormatLite::TYPE_##UPPERCASE>( \
              input, &value))                                               \
        return false;                                                       \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    }                                                                       \
    break

      HANDLE_TYPE(INT32, Int32, int32_t);
      HANDLE_TYPE(INT64, Int64, int64_t);
      HANDLE_TYPE(UINT32, UInt32, uint32_t);
      HANDLE_TYPE(UINT64, UInt64, uint64_t);
      HANDLE_TYPE(SINT32, Int32, int32_t);
      HANDLE_TYPE(SINT64, Int64, int64_t);
      HANDLE_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (extension.enum_validity_check.func(
                  extension.enum_validity_check.arg, value)) {
            AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed,
                    value, extension.descriptor);
          } else {
            // Invalid value.  Treat as unknown.
            field_skipper->SkipUnknownEnum(number, value);
          }
        }
        break;

      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }

    input->PopLimit(limit);
  } else {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE, CPP_LOWERCASE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    CPP_LOWERCASE value;                                                    \
    if (!WireFormatLite::ReadPrimitive<CPP_LOWERCASE,                       \
                                       WireFormatLite::TYPE_##UPPERCASE>(   \
            input, &value))                                                 \
      return false;                                                         \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_TYPE(INT32, Int32, int32_t);
      HANDLE_TYPE(INT64, Int64, int64_t);
      HANDLE_TYPE(UINT32, UInt32, uint32_t);
      HANDLE_TYPE(UINT64, UInt64, uint64_t);
      HANDLE_TYPE(SINT32, Int32, int32_t);
      HANDLE_TYPE(SINT64, Int64, int64_t);
      HANDLE_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_TYPE(FLOAT, Float, float);
      HANDLE_TYPE(DOUBLE, Double, double);
      HANDLE_TYPE(BOOL, Bool, bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          // Invalid value.  Treat as unknown.
          field_skipper->SkipUnknownEnum(number, value);
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        if (!WireFormatLite::ReadString(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_BYTES: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_BYTES,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_BYTES,
                                extension.descriptor);
        if (!WireFormatLite::ReadBytes(input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadGroup(number, input, value)) return false;
        break;
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        if (!WireFormatLite::ReadMessage(input, value)) return false;
        break;
      }
    }
  }

  return true;
}